

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebur128.c
# Opt level: O2

int ebur128_relative_threshold(ebur128_state *st,double *out)

{
  int iVar1;
  double dVar2;
  undefined1 auVar3 [16];
  double local_20;
  size_t above_thresh_counter;
  
  local_20 = 0.0;
  above_thresh_counter = 0;
  if ((~st->mode & 5U) == 0) {
    ebur128_calc_relative_threshold(st,&above_thresh_counter,&local_20);
    if (above_thresh_counter == 0) {
      dVar2 = -70.0;
    }
    else {
      auVar3._8_4_ = (int)(above_thresh_counter >> 0x20);
      auVar3._0_8_ = above_thresh_counter;
      auVar3._12_4_ = 0x45300000;
      dVar2 = ebur128_energy_to_loudness
                        ((local_20 /
                         ((auVar3._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)above_thresh_counter) -
                         4503599627370496.0))) * relative_gate_factor);
    }
    *out = dVar2;
    iVar1 = 0;
  }
  else {
    iVar1 = 2;
  }
  return iVar1;
}

Assistant:

int ebur128_relative_threshold(ebur128_state* st, double* out) {
  double relative_threshold = 0.0;
  size_t above_thresh_counter = 0;

  if ((st->mode & EBUR128_MODE_I) != EBUR128_MODE_I) {
    return EBUR128_ERROR_INVALID_MODE;
  }

  ebur128_calc_relative_threshold(st, &above_thresh_counter,
                                  &relative_threshold);

  if (!above_thresh_counter) {
    *out = -70.0;
    return EBUR128_SUCCESS;
  }

  relative_threshold /= (double) above_thresh_counter;
  relative_threshold *= relative_gate_factor;

  *out = ebur128_energy_to_loudness(relative_threshold);
  return EBUR128_SUCCESS;
}